

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaPValAttrNode
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaBasicItemPtr ownerItem,xmlAttrPtr attr,
              xmlSchemaTypePtr type,xmlChar **value)

{
  xmlChar *value_00;
  xmlChar *val;
  xmlChar **value_local;
  xmlSchemaTypePtr type_local;
  xmlAttrPtr attr_local;
  xmlSchemaBasicItemPtr ownerItem_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if (((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (type == (xmlSchemaTypePtr)0x0)) ||
     (attr == (xmlAttrPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    value_00 = xmlSchemaGetNodeContent(ctxt,(xmlNodePtr)attr);
    if (value != (xmlChar **)0x0) {
      *value = value_00;
    }
    ctxt_local._4_4_ = xmlSchemaPValAttrNodeValue(ctxt,ownerItem,attr,value_00,type);
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaPValAttrNode(xmlSchemaParserCtxtPtr ctxt,
			   xmlSchemaBasicItemPtr ownerItem,
			   xmlAttrPtr attr,
			   xmlSchemaTypePtr type,
			   const xmlChar **value)
{
    const xmlChar *val;

    if ((ctxt == NULL) || (type == NULL) || (attr == NULL))
	return (-1);

    val = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
    if (value != NULL)
	*value = val;

    return (xmlSchemaPValAttrNodeValue(ctxt, ownerItem, attr,
	val, type));
}